

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemoryRegion *
flatview_translate_mips64
          (uc_struct_conflict6 *uc,FlatView *fv,hwaddr addr,hwaddr *xlat,hwaddr *plen,_Bool is_write
          ,MemTxAttrs attrs)

{
  MemoryRegionSection local_d8;
  AddressSpace *local_90;
  AddressSpace *as;
  MemoryRegionSection section;
  MemoryRegion *mr;
  _Bool is_write_local;
  hwaddr *plen_local;
  hwaddr *xlat_local;
  hwaddr addr_local;
  FlatView *fv_local;
  uc_struct_conflict6 *uc_local;
  MemTxAttrs attrs_local;
  
  local_90 = (AddressSpace *)0x0;
  flatview_do_translate(&local_d8,uc,fv,addr,xlat,plen,(hwaddr *)0x0,is_write,true,&local_90,attrs);
  memcpy(&as,&local_d8,0x40);
  return section.size._8_8_;
}

Assistant:

MemoryRegion *flatview_translate(struct uc_struct *uc, FlatView *fv, hwaddr addr, hwaddr *xlat,
                                 hwaddr *plen, bool is_write,
                                 MemTxAttrs attrs)
{
    MemoryRegion *mr;
    MemoryRegionSection section;
    AddressSpace *as = NULL;

    /* This can be MMIO, so setup MMIO bit. */
    section = flatview_do_translate(uc, fv, addr, xlat, plen, NULL,
                                    is_write, true, &as, attrs);
    mr = section.mr;

    return mr;
}